

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns.c
# Opt level: O3

void UpdateBuffer(int16_t *frame,size_t frame_length,size_t buffer_length,float *buffer)

{
  size_t sVar1;
  
  if (frame_length * 2 <= buffer_length) {
    __assert_fail("buffer_length < 2 * frame_length",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/congjiye[P]visiable-webrtc-audio-processing/src/ns.c"
                  ,0x5f4,"void UpdateBuffer(const int16_t *, size_t, size_t, float *)");
  }
  memcpy(buffer,buffer + frame_length,(buffer_length - frame_length) * 4);
  if (frame != (int16_t *)0x0) {
    if (frame_length != 0) {
      sVar1 = 0;
      do {
        buffer[(buffer_length - frame_length) + sVar1] = (float)(int)frame[sVar1];
        sVar1 = sVar1 + 1;
      } while (frame_length != sVar1);
    }
    return;
  }
  memset(buffer + (buffer_length - frame_length),0,frame_length * 4);
  return;
}

Assistant:

static void UpdateBuffer(const int16_t *frame, size_t frame_length, size_t buffer_length, float *buffer) {
    assert(buffer_length < 2 * frame_length);

    memcpy(buffer, buffer + frame_length, sizeof(*buffer) * (buffer_length - frame_length));
    if (frame) {
        int i = 0;
        for (i = 0; i < frame_length; ++i) {
            buffer[buffer_length - frame_length + i] = frame[i];
        }
    } else {
        memset(buffer + buffer_length - frame_length, 0, sizeof(*buffer) * frame_length);
    }
}